

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O3

uint32_t lzma_mf_find(lzma_mf *mf,uint32_t *count_ptr,lzma_match *matches)

{
  ulong uVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint8_t *__s1;
  ulong uVar7;
  
  uVar2 = (*mf->find)(mf,matches);
  if (uVar2 == 0) {
    uVar5 = 0;
  }
  else {
    uVar6 = mf->nice_len;
    uVar7 = 0;
    do {
      if (uVar6 < matches[uVar7].len) {
        __assert_fail("matches[i].len <= mf->nice_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x26,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
      uVar4 = mf->read_pos;
      if (uVar4 <= matches[uVar7].dist) {
        __assert_fail("matches[i].dist < mf->read_pos",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x27,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
      __s1 = mf->buffer + ((ulong)uVar4 - 1);
      iVar3 = bcmp(__s1,mf->buffer + ((ulong)uVar4 - (ulong)matches[uVar7].dist) + -2,
                   (ulong)matches[uVar7].len);
      if (iVar3 != 0) {
        __assert_fail("memcmp(mf_ptr(mf) - 1, mf_ptr(mf) - matches[i].dist - 2, matches[i].len) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x2a,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
    uVar5 = matches[uVar2 - 1].len;
    if (matches[uVar2 - 1].len == uVar6) {
      uVar4 = (mf->write_pos - uVar4) + 1;
      if (mf->match_len_max <= uVar4) {
        uVar4 = mf->match_len_max;
      }
      if (uVar4 < uVar6) {
        __assert_fail("len <= limit",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                      ,0x2e,
                      "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                     );
      }
      if ((int)uVar4 < 0) {
        __assert_fail("limit <= UINT32_MAX / 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                      ,0x2f,
                      "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                     );
      }
      uVar5 = uVar4;
      if (uVar6 < uVar4) {
        do {
          uVar7 = *(long *)(__s1 + uVar6) -
                  *(long *)(__s1 + (ulong)uVar6 + ~(ulong)matches[uVar2 - 1].dist);
          if (uVar7 != 0) {
            uVar1 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
              }
            }
            uVar5 = ((uint)(uVar1 >> 3) & 0x1fffffff) + uVar6;
            if (uVar4 <= uVar5) {
              uVar5 = uVar4;
            }
            break;
          }
          uVar6 = uVar6 + 8;
        } while (uVar6 < uVar4);
      }
    }
  }
  *count_ptr = uVar2;
  mf->read_ahead = mf->read_ahead + 1;
  return uVar5;
}

Assistant:

extern uint32_t
lzma_mf_find(lzma_mf *mf, uint32_t *count_ptr, lzma_match *matches)
{
	// Call the match finder. It returns the number of length-distance
	// pairs found.
	// FIXME: Minimum count is zero, what _exactly_ is the maximum?
	const uint32_t count = mf->find(mf, matches);

	// Length of the longest match; assume that no matches were found
	// and thus the maximum length is zero.
	uint32_t len_best = 0;

	if (count > 0) {
#ifndef NDEBUG
		// Validate the matches.
		for (uint32_t i = 0; i < count; ++i) {
			assert(matches[i].len <= mf->nice_len);
			assert(matches[i].dist < mf->read_pos);
			assert(memcmp(mf_ptr(mf) - 1,
				mf_ptr(mf) - matches[i].dist - 2,
				matches[i].len) == 0);
		}
#endif

		// The last used element in the array contains
		// the longest match.
		len_best = matches[count - 1].len;

		// If a match of maximum search length was found, try to
		// extend the match to maximum possible length.
		if (len_best == mf->nice_len) {
			// The limit for the match length is either the
			// maximum match length supported by the LZ-based
			// encoder or the number of bytes left in the
			// dictionary, whichever is smaller.
			uint32_t limit = mf_avail(mf) + 1;
			if (limit > mf->match_len_max)
				limit = mf->match_len_max;

			// Pointer to the byte we just ran through
			// the match finder.
			const uint8_t *p1 = mf_ptr(mf) - 1;

			// Pointer to the beginning of the match. We need -1
			// here because the match distances are zero based.
			const uint8_t *p2 = p1 - matches[count - 1].dist - 1;

			len_best = lzma_memcmplen(p1, p2, len_best, limit);
		}
	}

	*count_ptr = count;

	// Finally update the read position to indicate that match finder was
	// run for this dictionary offset.
	++mf->read_ahead;

	return len_best;
}